

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O0

wchar_t context_menu_command(wchar_t mx,wchar_t my)

{
  int iVar1;
  menu_conflict *m_00;
  wchar_t selected;
  menu_conflict *m;
  wchar_t my_local;
  wchar_t mx_local;
  
  m_00 = menu_dynamic_new();
  if (m_00 == (menu_conflict *)0x0) {
    my_local = L'\0';
  }
  else {
    m_00->selections = "abcdefghijklmnopqrstuvwxyz";
    menu_dynamic_add(m_00,"Item",1);
    menu_dynamic_add(m_00,"Action",2);
    menu_dynamic_add(m_00,"Item Management",3);
    menu_dynamic_add(m_00,"Info",4);
    menu_dynamic_add(m_00,"Util",5);
    menu_dynamic_add(m_00,"Misc",6);
    menu_dynamic_calc_location(m_00,mx,my);
    screen_save();
    region_erase_bordered(&m_00->boundary);
    prt("(Enter to select, ESC) Command:",L'\0',L'\0');
    iVar1 = menu_dynamic_select(m_00);
    menu_dynamic_free(m_00);
    screen_load();
    if (iVar1 < 1) {
      my_local = L'\0';
    }
    else {
      show_command_list(cmds_all[iVar1 + -1].list,(wchar_t)cmds_all[iVar1 + -1].len,mx,my);
      my_local = L'\x01';
    }
  }
  return my_local;
}

Assistant:

int context_menu_command(int mx, int my)
{
	struct menu *m;
	int selected;

	m = menu_dynamic_new();
	if (!m) {
		return 0;
	}

	m->selections = lower_case;
	menu_dynamic_add(m, "Item", 1);
	menu_dynamic_add(m, "Action", 2);
	menu_dynamic_add(m, "Item Management", 3);
	menu_dynamic_add(m, "Info", 4);
	menu_dynamic_add(m, "Util", 5);
	menu_dynamic_add(m, "Misc", 6);

	menu_dynamic_calc_location(m, mx, my);

	screen_save();
	region_erase_bordered(&m->boundary);

	prt("(Enter to select, ESC) Command:", 0, 0);
	selected = menu_dynamic_select(m);
	menu_dynamic_free(m);

	screen_load();

	/* XXX-AS this is gross, as is the way there's two ways to display the
	 * entire command list.  Fix me */
	if (selected > 0) {
		selected--;
		show_command_list(cmds_all[selected].list, cmds_all[selected].len,
						  mx, my);
	} else {
		return 0;
	}

	return 1;
}